

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O0

Vector * KDIS::DATA_TYPE::Vector::Lerp
                   (Vector *__return_storage_ptr__,Vector *From,Vector *To,KFLOAT32 T)

{
  Vector local_58;
  Vector local_40;
  KFLOAT32 local_24;
  Vector *pVStack_20;
  KFLOAT32 T_local;
  Vector *To_local;
  Vector *From_local;
  
  local_24 = T;
  pVStack_20 = To;
  To_local = From;
  From_local = __return_storage_ptr__;
  operator-(&local_58,To,From);
  operator*(&local_40,&local_58,local_24);
  operator+(__return_storage_ptr__,From,&local_40);
  ~Vector(&local_40);
  ~Vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

Vector Vector::Lerp( const Vector & From, const Vector & To, KFLOAT32 T )
{
    return From + ( ( To - From ) * T );
}